

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmPFlush<(moira::Instr)179,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  Syntax SVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  char *pcVar8;
  anon_class_4_1_ba1d4581 preg;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  SVar2 = str->style->syntax;
  if (((SVar2 & ~MOIRA_MIT) == GNU) &&
     (((uVar5 & 0x1c00) != 0x1000 || (0xfffffff9 < (uVar5 & 0x1e) - 8)))) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)179,(moira::Mode)10,4>(this,str,addr,op);
    return;
  }
  cVar7 = 'p';
  lVar6 = 1;
  do {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = cVar7;
    cVar7 = "pflush"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    pcVar8 = str->ptr;
    do {
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
    } while (pcVar8 < str->base + iVar3);
  }
  StrWriter::operator<<(str,(Fc)(uVar5 & 0x1f));
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ',';
  SVar4 = str->style->syntax;
  if ((SVar4 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar4 & 0x1f) & 1) != 0)) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = '#';
  StrWriter::operator<<(str,(UInt)((uint)(MOIRA_MIT < SVar2) * 8 + 7 & (uVar5 & 0xffff) >> 5));
  if ((uVar5 & 0x1c00) == 0x1800) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
    }
    Op<(moira::Mode)10,2>((Ea<(moira::Mode)10,_2> *)local_44,this,op & 7,addr);
    StrWriter::operator<<(str,(Ea<(moira::Mode)10,_2> *)local_44);
  }
  return;
}

Assistant:

void
Moira::dasmPFlush(StrWriter &str, u32 &addr, u16 op) const
{
    auto old  = addr;
    auto ext  = dasmIncRead<Word>(addr);
    auto reg  = _____________xxx (op);
    auto mode = ___xxx__________ (ext);
    auto mask = _______xxxx_____ (ext);
    auto fc   = ___________xxxxx (ext);

    // Only the MC68851 has four mask bits. The 68030 only has three.
    if (str.style.syntax == Syntax::MOIRA || str.style.syntax == Syntax::MOIRA_MIT) mask &= 0b111;

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;
    str << Fc{fc} << Sep{} << Imu{mask};
    if (mode == 0b110) str << Sep{} << Op<M>(reg, addr);
}